

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall
World::AdminMsg(World *this,Command_Source *from,string *message,int minlevel,bool echo)

{
  Character *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  mapped_type *this_01;
  long lVar5;
  long lVar6;
  reference ppCVar7;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  Character *local_160;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  string local_80;
  byte local_4a;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string from_str;
  bool echo_local;
  int minlevel_local;
  string *message_local;
  Command_Source *from_local;
  World *this_local;
  
  local_4a = 0;
  from_str.field_2._M_local_buf[0xb] = echo;
  from_str.field_2._12_4_ = minlevel;
  if (from == (Command_Source *)0x0) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"server",&local_49);
  }
  else {
    (*from->_vptr_Command_Source[2])(local_48);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ChatMaxWidth",&local_a1);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(this->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_a0);
  iVar2 = util::variant::operator_cast_to_int(this_01);
  util::ucfirst(&local_e8,(string *)local_48);
  std::operator+(&local_c8,&local_e8,"  ");
  iVar3 = util::text_width(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"...",(allocator<char> *)((long)&builder.add_size + 7));
  util::text_cap(&local_80,message,iVar2 - iVar3,&local_108);
  std::__cxx11::string::operator=((string *)message,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  lVar5 = std::__cxx11::string::length();
  lVar6 = std::__cxx11::string::length();
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)&__range1,PACKET_TALK,PACKET_ADMIN,lVar5 + 2 + lVar6);
  PacketBuilder::AddBreakString((PacketBuilder *)&__range1,(string *)local_48,0xff);
  PacketBuilder::AddBreakString((PacketBuilder *)&__range1,message,0xff);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                     *)&character), bVar1) {
    ppCVar7 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppCVar7;
    local_160 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"+",&local_181);
    std::__cxx11::string::string((string *)&local_1a8,(string *)local_48);
    std::__cxx11::string::string((string *)&local_1c8,(string *)message);
    Character::AddChatLog(this_00,&local_180,&local_1a8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    if ((((from_str.field_2._M_local_buf[0xb] & 1U) != 0) || (local_160 != (Character *)from)) &&
       (uVar4 = (**(local_160->super_Command_Source)._vptr_Command_Source)(),
       (int)from_str.field_2._12_4_ <= (int)(uVar4 & 0xff))) {
      Character::Send(local_160,(PacketBuilder *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void World::AdminMsg(Command_Source *from, std::string message, int minlevel, bool echo)
{
	std::string from_str = from ? from->SourceName() : "server";

	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from_str) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_ADMIN, 2 + from_str.length() + message.length());
	builder.AddBreakString(from_str);
	builder.AddBreakString(message);

	UTIL_FOREACH(this->characters, character)
	{
		character->AddChatLog("+", from_str, message);

		if ((!echo && character == from) || character->SourceAccess() < minlevel)
		{
			continue;
		}

		character->Send(builder);
	}
}